

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::find_blob_index_by_name(Net *this,char *name)

{
  int iVar1;
  pointer pBVar2;
  long lVar3;
  ulong uVar4;
  
  pBVar2 = (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar2) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      iVar1 = std::__cxx11::string::compare
                        ((char *)((long)&(pBVar2->name)._M_dataplus._M_p + lVar3));
      if (iVar1 == 0) goto LAB_00125a17;
      uVar4 = uVar4 + 1;
      pBVar2 = (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x40;
    } while (uVar4 < (ulong)((long)(this->blobs).
                                   super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pBVar2 >> 6));
  }
  fprintf(_stderr,"find_blob_index_by_name %s failed\n",name);
  uVar4 = 0xffffffff;
LAB_00125a17:
  return (int)uVar4;
}

Assistant:

int Net::find_blob_index_by_name(const char* name) const
{
    for (size_t i=0; i<blobs.size(); i++)
    {
        const Blob& blob = blobs[i];
        if (blob.name == name)
        {
            return i;
        }
    }

    fprintf(stderr, "find_blob_index_by_name %s failed\n", name);
    return -1;
}